

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_entropy_adjoint(REF_DBL *primitive,REF_DBL *dual)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  REF_DBL gamma;
  REF_DBL vel2;
  REF_DBL s;
  REF_DBL p;
  REF_DBL w;
  REF_DBL v;
  REF_DBL u;
  REF_DBL rho;
  REF_DBL *dual_local;
  REF_DBL *primitive_local;
  
  __x = *primitive;
  dVar1 = primitive[1];
  dVar2 = primitive[2];
  dVar3 = primitive[3];
  dVar4 = primitive[4];
  dVar5 = pow(__x,1.4);
  dVar5 = log(dVar4 / dVar5);
  *dual = (1.4 - dVar5) / 0.3999999999999999 -
          (__x * 0.5 * (dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2)) / dVar4;
  dual[1] = (__x * dVar1) / dVar4;
  dual[2] = (__x * dVar2) / dVar4;
  dual[3] = (__x * dVar3) / dVar4;
  dual[4] = -__x / dVar4;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_entropy_adjoint(REF_DBL *primitive, REF_DBL *dual) {
  REF_DBL rho, u, v, w, p, s, vel2;
  REF_DBL gamma = 1.4;
  rho = primitive[0];
  u = primitive[1];
  v = primitive[2];
  w = primitive[3];
  p = primitive[4];
  /* entropy adjoint, Equ. (11), AIAA 2009-3790 */
  s = log(p / pow(rho, gamma));
  vel2 = u * u + v * v + w * w;
  dual[0] = (gamma - s) / (gamma - 1.0) - 0.5 * rho * vel2 / p;
  dual[1] = rho * u / p;
  dual[2] = rho * v / p;
  dual[3] = rho * w / p;
  dual[4] = -rho / p;

  return REF_SUCCESS;
}